

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::NewPlaceholderFileWithMutexHeld(DescriptorPool *this,string *name)

{
  Tables *pTVar1;
  FileDescriptor *__s;
  string *psVar2;
  FileOptions *pFVar3;
  SourceCodeInfo *pSVar4;
  FunctionClosure0 local_30;
  
  if (this->mutex_ != (Mutex *)0x0) {
    internal::Mutex::AssertHeld(this->mutex_);
  }
  pTVar1 = (this->tables_).ptr_;
  if (pTVar1 != (Tables *)0x0) {
    __s = (FileDescriptor *)Tables::AllocateBytes(pTVar1,0xc0);
    memset(__s,0,0xc0);
    pTVar1 = (this->tables_).ptr_;
    if (pTVar1 != (Tables *)0x0) {
      psVar2 = Tables::AllocateString(pTVar1,name);
      *(string **)__s = psVar2;
      if (internal::empty_string_once_init_ != 2) {
        local_30.super_Closure._vptr_Closure = (_func_int **)&PTR__FunctionClosure0_0072ead0;
        local_30.function_ = internal::InitEmptyString;
        local_30.self_deleting_ = false;
        GoogleOnceInitImpl(&internal::empty_string_once_init_,&local_30.super_Closure);
        internal::FunctionClosure0::~FunctionClosure0(&local_30);
      }
      *(undefined8 **)(__s + 8) = &internal::fixed_address_empty_string_abi_cxx11_;
      *(DescriptorPool **)(__s + 0x10) = this;
      pFVar3 = FileOptions::default_instance();
      *(FileOptions **)(__s + 0xa0) = pFVar3;
      if ((anonymous_namespace)::file_descriptor_tables_once_init_ != 2) {
        local_30.super_Closure._vptr_Closure = (_func_int **)&PTR__FunctionClosure0_0072ead0;
        local_30.function_ = anon_unknown_1::InitFileDescriptorTables;
        local_30.self_deleting_ = false;
        GoogleOnceInitImpl(&(anonymous_namespace)::file_descriptor_tables_once_init_,
                           &local_30.super_Closure);
        internal::FunctionClosure0::~FunctionClosure0(&local_30);
      }
      *(undefined8 *)(__s + 0xa8) = (anonymous_namespace)::file_descriptor_tables_;
      pSVar4 = SourceCodeInfo::default_instance();
      *(SourceCodeInfo **)(__s + 0xb0) = pSVar4;
      __s[0x90] = (FileDescriptor)0x1;
      *(undefined4 *)(__s + 0x8c) = 2;
      __s[0xb8] = (FileDescriptor)0x1;
      return __s;
    }
  }
  __assert_fail("ptr_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                ,0x5f,
                "C *google::protobuf::internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->() const [C = google::protobuf::DescriptorPool::Tables]"
               );
}

Assistant:

FileDescriptor* DescriptorPool::NewPlaceholderFileWithMutexHeld(
    const string& name) const {
  if (mutex_) {
    mutex_->AssertHeld();
  }
  FileDescriptor* placeholder = tables_->Allocate<FileDescriptor>();
  memset(placeholder, 0, sizeof(*placeholder));

  placeholder->name_ = tables_->AllocateString(name);
  placeholder->package_ = &internal::GetEmptyString();
  placeholder->pool_ = this;
  placeholder->options_ = &FileOptions::default_instance();
  placeholder->tables_ = &FileDescriptorTables::GetEmptyInstance();
  placeholder->source_code_info_ = &SourceCodeInfo::default_instance();
  placeholder->is_placeholder_ = true;
  placeholder->syntax_ = FileDescriptor::SYNTAX_PROTO2;
  placeholder->finished_building_ = true;
  // All other fields are zero or NULL.

  return placeholder;
}